

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O1

ZyanStatus
ZydisDecoderDecodeOperands
          (ZydisDecoder *decoder,ZydisDecoderContext *context,ZydisDecodedInstruction *instruction,
          ZydisDecodedOperand *operands,ZyanU8 operand_count)

{
  byte bVar1;
  ZydisInstructionEncoding ZVar2;
  ZydisBroadcastMode ZVar3;
  int iVar4;
  ZydisElementSize ZVar5;
  byte bVar6;
  ZyanU16 ZVar7;
  short sVar8;
  ZydisRegisterWidth ZVar9;
  ushort uVar10;
  ZydisElementSize ZVar11;
  ZyanStatus ZVar12;
  ZydisMemoryOperandType ZVar13;
  ZydisRegister ZVar14;
  ZydisOperandDefinition *pZVar15;
  ulong uVar16;
  ZydisMemoryOperandType ZVar17;
  ZydisElementType ZVar18;
  uint uVar20;
  ZydisDecodedInstructionRawImmValue_ ZVar19;
  uint uVar21;
  ZyanU8 ZVar22;
  ZydisRegisterClass ZVar23;
  ZydisInternalElementType element;
  byte bVar24;
  long lVar25;
  ZyanU8 ZVar26;
  ZydisDecodedOperand *operand;
  bool bVar27;
  bool bVar28;
  
  ZVar12 = 0x80100004;
  if ((context != (ZydisDecoderContext *)0x0 && decoder != (ZydisDecoder *)0x0) &&
     (instruction != (ZydisDecodedInstruction *)0x0 &&
      (ZydisInstructionDefinition *)context->definition != (ZydisInstructionDefinition *)0x0)) {
    if ((operand_count < 0xb) &&
       ((operands != (ZydisDecodedOperand *)0x0 || operand_count == '\0' &&
        (ZVar12 = 0x8010000d, (decoder->decoder_mode & 1) == 0)))) {
      uVar20._0_1_ = instruction->operand_count;
      uVar20._1_1_ = instruction->operand_count_visible;
      uVar20._2_2_ = *(undefined2 *)&instruction->field_0x1a;
      uVar21 = (uint)operand_count;
      if ((byte)(undefined1)uVar20 < operand_count) {
        uVar21 = uVar20;
      }
      ZVar12 = 0x100000;
      if ((char)uVar21 != '\0') {
        if (operands == (ZydisDecodedOperand *)0x0) {
          __assert_fail("operands",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x640,
                        "ZyanStatus ZydisDecodeOperands(const ZydisDecoder *, const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZyanU8)"
                       );
        }
        pZVar15 = ZydisGetOperandDefinitions((ZydisInstructionDefinition *)context->definition);
        memset(operands,0,(ulong)((uVar21 & 0xff) << 4) * 5);
        ZVar26 = '\0';
        lVar25 = 0;
        bVar24 = 0;
        operand = operands;
LAB_0010f123:
        operand->id = ZVar26;
        operand->visibility =
             *(ushort *)((long)pZVar15->size + lVar25 + -2) >> 6 & ZYDIS_OPERAND_VISIBILITY_HIDDEN;
        operand->actions = *(byte *)((long)pZVar15->size + lVar25 + -1) & 0xf;
        uVar10 = *(ushort *)((long)pZVar15->size + lVar25 + -2) & 0x3f;
        if (uVar10 == 3) {
          operand->type = ZYDIS_OPERAND_TYPE_IMMEDIATE;
          operand->size = 8;
          (operand->field_10).imm.value.u = 1;
          (operand->field_10).ptr.segment = 0;
          goto LAB_0010f3ed;
        }
        if (uVar10 == 2) {
          operand->type = ZYDIS_OPERAND_TYPE_MEMORY;
          (operand->field_10).mem.type = ZYDIS_MEMOP_TYPE_MEM;
          switch(*(byte *)((long)pZVar15->size + lVar25 + 7) >> 3 & 0xf) {
          case 0:
            ZVar23 = *(ZydisRegisterClass *)
                      (ZydisDecodeOperandImplicitMemory_lookup + (ulong)context->easz_index * 4);
            ZVar22 = (context->reg_info).id_reg;
            break;
          case 1:
            ZVar23 = *(ZydisRegisterClass *)
                      (ZydisDecodeOperandImplicitMemory_lookup + (ulong)context->easz_index * 4);
            ZVar22 = (context->reg_info).id_rm;
            break;
          case 2:
            ZVar23 = *(ZydisRegisterClass *)
                      (ZydisDecodeOperandImplicitMemory_lookup + (ulong)context->easz_index * 4);
            ZVar22 = '\0';
            break;
          case 3:
            ZVar23 = *(ZydisRegisterClass *)
                      (ZydisDecodeOperandImplicitMemory_lookup + (ulong)context->easz_index * 4);
            ZVar22 = '\x02';
            break;
          case 4:
            ZVar23 = *(ZydisRegisterClass *)
                      (ZydisDecodeOperandImplicitMemory_lookup + (ulong)context->easz_index * 4);
            ZVar22 = '\x03';
            break;
          case 5:
            ZVar23 = *(ZydisRegisterClass *)
                      (ZydisDecodeOperandImplicitMemory_lookup + (ulong)context->easz_index * 4);
            ZVar22 = '\x06';
            break;
          case 6:
            ZVar23 = *(ZydisRegisterClass *)
                      (ZydisDecodeOperandImplicitMemory_lookup + (ulong)context->easz_index * 4);
            ZVar22 = '\a';
            break;
          case 7:
            ZVar23 = *(ZydisRegisterClass *)
                      (ZydisDecodeOperandImplicitMemory_lookup + (ulong)decoder->stack_width * 4);
            ZVar22 = '\x04';
            break;
          case 8:
            ZVar23 = *(ZydisRegisterClass *)
                      (ZydisDecodeOperandImplicitMemory_lookup + (ulong)decoder->stack_width * 4);
            ZVar22 = '\x05';
            break;
          default:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x62c,
                          "void ZydisDecodeOperandImplicitMemory(const ZydisDecoder *, const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                         );
          }
          ZVar14 = ZydisRegisterEncode(ZVar23,ZVar22);
          (operand->field_10).mem.base = ZVar14;
          bVar6 = *(byte *)((long)pZVar15->size + lVar25 + 7) & 7;
          if (bVar6 != 0) {
            ZVar14 = ZydisRegisterEncode(ZYDIS_REGCLASS_SEGMENT,bVar6 - 1);
            (operand->field_10).mem.segment = ZVar14;
            if (ZVar14 == ZYDIS_REGISTER_NONE) {
              __assert_fail("operand->mem.segment",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x633,
                            "void ZydisDecodeOperandImplicitMemory(const ZydisDecoder *, const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                           );
            }
          }
          goto LAB_0010f3ed;
        }
        if (uVar10 != 1) goto LAB_0010f3ed;
        operand->type = ZYDIS_OPERAND_TYPE_REGISTER;
        switch(*(byte *)((long)pZVar15->size + lVar25 + 7) & 7) {
        case 0:
          ZVar17 = *(ushort *)((long)pZVar15->size + lVar25 + 8) & 0x1ff;
          break;
        case 1:
          ZVar23 = *(ZydisRegisterClass *)
                    (ZydisDecodeOperandImplicitMemory_lookup + (ulong)context->eosz_index * 4);
          goto LAB_0010f278;
        case 2:
          bVar28 = instruction->address_width != ' ';
          bVar27 = instruction->address_width == '\x10';
          goto LAB_0010f270;
        case 3:
          ZVar17 = instruction->address_width == ' ' ^ 0xc5;
          bVar28 = instruction->address_width == '\x10';
          ZVar13 = 0xc3;
          goto LAB_0010f2c1;
        case 4:
          ZVar17 = 0xc5 - (decoder->stack_width < ZYDIS_STACK_WIDTH_64);
          break;
        case 5:
          bVar28 = decoder->stack_width != ZYDIS_STACK_WIDTH_32;
          bVar27 = decoder->stack_width == ZYDIS_STACK_WIDTH_16;
LAB_0010f270:
          ZVar23 = bVar28 + ZYDIS_REGCLASS_GPR32;
          if (bVar27) {
            ZVar23 = ZYDIS_REGCLASS_GPR16;
          }
LAB_0010f278:
          ZVar17 = ZydisRegisterEncode(ZVar23,*(byte *)((long)pZVar15->size + lVar25 + 8) & 0x3f);
          break;
        case 6:
          ZVar17 = (decoder->stack_width != ZYDIS_STACK_WIDTH_32) + 0xc1;
          bVar28 = decoder->stack_width == ZYDIS_STACK_WIDTH_16;
          ZVar13 = 0xc0;
LAB_0010f2c1:
          if (bVar28) {
            ZVar17 = ZVar13;
          }
          (operand->field_10).mem.type = ZVar17;
          goto LAB_0010f3ed;
        case 7:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x5e9,
                        "void ZydisDecodeOperandImplicitRegister(const ZydisDecoder *, const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                       );
        }
        (operand->field_10).mem.type = ZVar17;
LAB_0010f3ed:
        if (operand->type != ZYDIS_OPERAND_TYPE_UNUSED) goto LAB_0010f6a6;
        operand->encoding =
             *(byte *)((long)pZVar15->size + lVar25 + 7) &
             (ZYDIS_OPERAND_ENCODING_JIMM16_32_64|ZYDIS_OPERAND_ENCODING_JIMM64);
        uVar10 = *(ushort *)((long)pZVar15->size + lVar25 + -2) & 0x3f;
        switch(uVar10) {
        case 4:
          ZVar23 = ZYDIS_REGCLASS_GPR8;
          break;
        case 5:
          ZVar23 = ZYDIS_REGCLASS_GPR16;
          break;
        case 6:
          ZVar23 = ZYDIS_REGCLASS_GPR32;
          break;
        case 7:
          ZVar23 = ZYDIS_REGCLASS_GPR64;
          break;
        case 8:
          bVar6 = instruction->operand_width;
          if ((0x30 < bVar6 - 0x10) ||
             ((0x1000000010001U >> ((ulong)(bVar6 - 0x10) & 0x3f) & 1) == 0)) {
            __assert_fail("(instruction->operand_width == 16) || (instruction->operand_width == 32) || (instruction->operand_width == 64)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x685,
                          "ZyanStatus ZydisDecodeOperands(const ZydisDecoder *, const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZyanU8)"
                         );
          }
          goto LAB_0010f4cf;
        case 9:
          uVar20 = instruction->operand_width - 0x10;
          if ((0x30 < uVar20) || ((0x1000000010001U >> ((ulong)uVar20 & 0x3f) & 1) == 0)) {
            __assert_fail("(instruction->operand_width == 16) || (instruction->operand_width == 32) || (instruction->operand_width == 64)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x68c,
                          "ZyanStatus ZydisDecodeOperands(const ZydisDecoder *, const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZyanU8)"
                         );
          }
          ZVar23 = ZYDIS_REGCLASS_GPR64 - ((instruction->operand_width - 0x10 & 0xef) == 0);
          break;
        case 10:
          uVar20 = instruction->operand_width - 0x10;
          if ((0x30 < uVar20) || ((0x1000000010001U >> ((ulong)uVar20 & 0x3f) & 1) == 0)) {
            __assert_fail("(instruction->operand_width == 16) || (instruction->operand_width == 32) || (instruction->operand_width == 64)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x693,
                          "ZyanStatus ZydisDecodeOperands(const ZydisDecoder *, const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZyanU8)"
                         );
          }
          ZVar23 = instruction->operand_width == 0x10 ^ ZYDIS_REGCLASS_GPR32;
          break;
        case 0xb:
          bVar6 = instruction->address_width;
          if ((0x30 < bVar6 - 0x10) ||
             ((0x1000000010001U >> ((ulong)(bVar6 - 0x10) & 0x3f) & 1) == 0)) {
            __assert_fail("(instruction->address_width == 16) || (instruction->address_width == 32) || (instruction->address_width == 64)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x699,
                          "ZyanStatus ZydisDecodeOperands(const ZydisDecoder *, const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZyanU8)"
                         );
          }
LAB_0010f4cf:
          ZVar23 = (bVar6 != 0x20) + ZYDIS_REGCLASS_GPR32;
          if (bVar6 == 0x10) {
            ZVar23 = ZYDIS_REGCLASS_GPR16;
          }
          break;
        case 0xc:
          ZVar23 = ZYDIS_REGCLASS_REQUIRED_BITS;
          break;
        case 0xd:
          ZVar23 = ZYDIS_REGCLASS_MMX;
          break;
        case 0xe:
          ZVar23 = ZYDIS_REGCLASS_XMM;
          break;
        case 0xf:
          ZVar23 = ZYDIS_REGCLASS_YMM;
          break;
        case 0x10:
          ZVar23 = ZYDIS_REGCLASS_ZMM;
          break;
        case 0x11:
          ZVar23 = ZYDIS_REGCLASS_TMM;
          break;
        case 0x12:
          ZVar23 = ZYDIS_REGCLASS_BOUND;
          break;
        case 0x13:
          ZVar23 = ZYDIS_REGCLASS_SEGMENT;
          break;
        case 0x14:
          ZVar23 = ZYDIS_REGCLASS_CONTROL;
          break;
        case 0x15:
          ZVar23 = ZYDIS_REGCLASS_DEBUG;
          break;
        case 0x16:
          ZVar23 = ZYDIS_REGCLASS_MASK;
          break;
        default:
          ZVar23 = ZYDIS_REGCLASS_INVALID;
        }
        if (ZVar23 != ZYDIS_REGCLASS_INVALID) {
          switch(*(byte *)((long)pZVar15->size + lVar25 + 7) & 0x3f) {
          case 1:
            bVar6 = (context->reg_info).id_reg;
            break;
          case 2:
            bVar6 = (context->reg_info).id_rm;
            break;
          case 3:
            bVar6 = ZydisCalcRegisterId(context,instruction,ZYDIS_REG_ENCODING_OPCODE,ZVar23);
            break;
          case 4:
            bVar6 = (context->reg_info).id_ndsndd;
            break;
          case 5:
            bVar1 = *(byte *)&(instruction->raw).imm[0].value;
            bVar6 = bVar1 >> 4;
            if (instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) {
              if ((ZVar23 - ZYDIS_REGCLASS_XMM < 3) &&
                 ((instruction->encoding & ~ZYDIS_INSTRUCTION_ENCODING_3DNOW) ==
                  ZYDIS_INSTRUCTION_ENCODING_EVEX)) {
                bVar6 = bVar6 | bVar1 * '\x02' & 0x10;
              }
            }
            else {
              bVar6 = bVar6 & 7;
            }
            break;
          case 6:
            bVar6 = (context->vector_unified).mask;
            break;
          default:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x6f1,
                          "ZyanStatus ZydisDecodeOperands(const ZydisDecoder *, const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZyanU8)"
                         );
          }
          ZydisDecodeOperandRegister(instruction,operand,ZVar23,bVar6);
          if ((*(byte *)((long)pZVar15->size + lVar25 + 10) & 1) != 0) {
            operand->attributes = operand->attributes | 1;
          }
          goto LAB_0010f6a6;
        }
        switch(uVar10) {
        case 0x17:
          ZydisDecodeOperandMemory(context,instruction,operand,ZYDIS_REGCLASS_INVALID);
          break;
        case 0x18:
          ZVar23 = ZYDIS_REGCLASS_XMM;
          goto LAB_0010f822;
        case 0x19:
          ZVar23 = ZYDIS_REGCLASS_YMM;
          goto LAB_0010f822;
        case 0x1a:
          ZVar23 = ZYDIS_REGCLASS_ZMM;
LAB_0010f822:
          ZydisDecodeOperandMemory(context,instruction,operand,ZVar23);
          (operand->field_10).mem.type = ZYDIS_MEMOP_TYPE_MAX_VALUE;
          break;
        case 0x1d:
          ZVar22 = (instruction->raw).imm[0].size;
          if ((ZVar22 != '\x10') && (ZVar22 != ' ')) {
            __assert_fail("(instruction->raw.imm[0].size == 16) || (instruction->raw.imm[0].size == 32)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x718,
                          "ZyanStatus ZydisDecodeOperands(const ZydisDecoder *, const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZyanU8)"
                         );
          }
          if ((instruction->raw).imm[1].size != '\x10') {
            __assert_fail("instruction->raw.imm[1].size == 16",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x719,
                          "ZyanStatus ZydisDecodeOperands(const ZydisDecoder *, const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZyanU8)"
                         );
          }
          operand->type = ZYDIS_OPERAND_TYPE_POINTER;
          (operand->field_10).mem.segment = *(ZydisRegister *)&(instruction->raw).imm[0].value;
          (operand->field_10).ptr.segment = *(ZyanU16 *)&(instruction->raw).imm[1].value;
          break;
        case 0x1e:
          operand->actions = '\0';
          ZydisDecodeOperandMemory(context,instruction,operand,ZYDIS_REGCLASS_INVALID);
          (operand->field_10).mem.type = ZYDIS_MEMOP_TYPE_AGEN;
          break;
        case 0x1f:
          if ((instruction->raw).disp.size == '\0') {
            __assert_fail("instruction->raw.disp.size",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x726,
                          "ZyanStatus ZydisDecodeOperands(const ZydisDecoder *, const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZyanU8)"
                         );
          }
          operand->type = ZYDIS_OPERAND_TYPE_MEMORY;
          (operand->field_10).mem.type = ZYDIS_MEMOP_TYPE_MEM;
          *(ZyanU8 *)((long)&operand->field_10 + 0x21) = (instruction->raw).disp.size;
          *(ZyanU8 *)((long)&operand->field_10 + 0x20) = (instruction->raw).disp.offset;
          (operand->field_10).mem.disp.value = (instruction->raw).disp.value;
          break;
        case 0x20:
          operand->actions = '\0';
          ZydisDecodeOperandMemory(context,instruction,operand,ZYDIS_REGCLASS_INVALID);
          (operand->field_10).mem.type = ZYDIS_MEMOP_TYPE_MIB;
        }
        if (operand->type == ZYDIS_OPERAND_TYPE_UNUSED) {
          uVar10 = *(ushort *)((long)pZVar15->size + lVar25 + -2) & 0x3f;
          if (uVar10 == 0x1b) {
LAB_0010f8ed:
            if (1 < bVar24) {
              __assert_fail("(imm_id == 0) || (imm_id == 1)",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x74d,
                            "ZyanStatus ZydisDecodeOperands(const ZydisDecoder *, const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZyanU8)"
                           );
            }
            operand->type = ZYDIS_OPERAND_TYPE_IMMEDIATE;
            operand->size =
                 *(short *)((long)pZVar15->size + (ulong)context->eosz_index * 2 + lVar25) << 3;
            if ((*(byte *)((long)pZVar15->size + lVar25 + 7) & 0x3f) == 5) {
              if ((instruction->raw).imm[bVar24].size != '\b') {
                __assert_fail("instruction->raw.imm[imm_id].size == 8",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                              ,0x753,
                              "ZyanStatus ZydisDecodeOperands(const ZydisDecoder *, const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZyanU8)"
                             );
              }
              ZVar19._0_4_ = (uint)(instruction->raw).imm[bVar24].value.u & 0xf;
              ZVar19.u._4_4_ = 0;
            }
            else {
              ZVar19 = (instruction->raw).imm[bVar24].value;
            }
            *(ZydisDecodedInstructionRawImmValue_ *)((long)&operand->field_10 + 8) = ZVar19;
            (operand->field_10).mem.scale = (instruction->raw).imm[0].offset;
            (operand->field_10).imm.size = (instruction->raw).imm[0].size;
            (operand->field_10).imm.is_signed = (instruction->raw).imm[bVar24].is_signed;
            (operand->field_10).imm.is_relative = (instruction->raw).imm[bVar24].is_relative;
            bVar24 = bVar24 + 1;
          }
          else if (uVar10 == 0x1c) {
            if ((instruction->raw).imm[bVar24].is_relative == '\0') {
              __assert_fail("instruction->raw.imm[imm_id].is_relative",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x74a,
                            "ZyanStatus ZydisDecodeOperands(const ZydisDecoder *, const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZyanU8)"
                           );
            }
            goto LAB_0010f8ed;
          }
          if (operand->type != ZYDIS_OPERAND_TYPE_IMMEDIATE) {
            __assert_fail("operands[i].type == ZYDIS_OPERAND_TYPE_IMMEDIATE",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x763,
                          "ZyanStatus ZydisDecodeOperands(const ZydisDecoder *, const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZyanU8)"
                         );
          }
        }
        else if (((instruction->encoding & ~ZYDIS_INSTRUCTION_ENCODING_3DNOW) ==
                  ZYDIS_INSTRUCTION_ENCODING_EVEX) && ((instruction->raw).disp.size == '\b')) {
          (operand->field_10).mem.disp.value =
               (ulong)context->cd8_scale * (operand->field_10).mem.disp.value;
        }
LAB_0010f6a6:
        if (operand->type == ZYDIS_OPERAND_TYPE_MEMORY) {
          if ((*(byte *)((long)pZVar15->size + lVar25 + 10) & 2) == 0) {
            uVar16 = instruction->attributes;
            if ((uVar16 >> 0x25 & 1) == 0) {
              if ((uVar16 >> 0x26 & 1) != 0) goto LAB_0010f718;
              if ((uVar16 >> 0x27 & 1) != 0) goto LAB_0010f732;
              if ((uVar16 >> 0x28 & 1) == 0) {
                if ((uVar16 >> 0x29 & 1) == 0) {
                  if ((uVar16 >> 0x2a & 1) == 0) goto LAB_0010f6f3;
                  (operand->field_10).mem.segment = ZYDIS_REGISTER_GS;
                }
                else {
                  (operand->field_10).mem.segment = ZYDIS_REGISTER_FS;
                }
              }
              else {
                (operand->field_10).mem.segment = ZYDIS_REGISTER_ES;
              }
            }
            else {
              (operand->field_10).mem.segment = ZYDIS_REGISTER_CS;
            }
          }
          else {
LAB_0010f6f3:
            if ((operand->field_10).mem.segment == ZYDIS_REGISTER_NONE) {
              uVar16 = (ulong)(operand->field_10).mem.base;
              if ((uVar16 < 0x3b) && ((0x600060006000000U >> (uVar16 & 0x3f) & 1) != 0)) {
LAB_0010f718:
                (operand->field_10).mem.segment = ZYDIS_REGISTER_SS;
              }
              else {
LAB_0010f732:
                (operand->field_10).mem.segment = ZYDIS_REGISTER_DS;
              }
            }
          }
        }
        switch(operand->type) {
        case ZYDIS_OPERAND_TYPE_REGISTER:
          sVar8 = *(short *)((long)pZVar15->size + lVar25 + (ulong)context->eosz_index * 2);
          if (sVar8 == 0) {
            ZVar9 = ZydisRegisterGetWidth(instruction->machine_mode,(operand->field_10).mem.type);
          }
          else {
            ZVar9 = sVar8 << 3;
          }
          operand->size = ZVar9;
          operand->element_type = ZYDIS_ELEMENT_TYPE_INT;
          operand->element_size = ZVar9;
          goto LAB_0010faef;
        case ZYDIS_OPERAND_TYPE_MEMORY:
          ZVar2 = instruction->encoding;
          if (ZVar2 < ZYDIS_INSTRUCTION_ENCODING_EVEX) {
            sVar8 = *(short *)((long)pZVar15->size + lVar25 + (ulong)context->eosz_index * 2);
            if ((operand->field_10).mem.type != ZYDIS_MEMOP_TYPE_AGEN) {
              if ((sVar8 == 0) && ((instruction->meta).category != ZYDIS_CATEGORY_AMX_TILE)) {
                __assert_fail("definition->size[context->eosz_index] || (instruction->meta.category == ZYDIS_CATEGORY_AMX_TILE)"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                              ,0x3ec,
                              "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                             );
              }
              goto LAB_0010fa5d;
            }
            if (sVar8 != 0) {
              __assert_fail("definition->size[context->eosz_index] == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x3e6,
                            "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                           );
            }
            operand->size = (ushort)instruction->address_width;
            operand->element_type = ZYDIS_ELEMENT_TYPE_INT;
            goto LAB_0010faef;
          }
          if (ZVar2 == ZYDIS_INSTRUCTION_ENCODING_EVEX) {
            sVar8 = *(short *)((long)pZVar15->size + lVar25 + (ulong)context->eosz_index * 2);
            if (sVar8 == 0) {
              uVar10 = (instruction->avx).vector_length;
              if (uVar10 == 0) {
                __assert_fail("instruction->avx.vector_length",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                              ,0x3fa,
                              "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                             );
              }
              bVar6 = (context->evex).element_size;
              if (bVar6 == 0) {
                __assert_fail("context->evex.element_size",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                              ,0x3fb,
                              "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                             );
              }
              ZVar22 = (context->evex).tuple_type;
              if (ZVar22 == '\x10') {
                if ((instruction->avx).broadcast.mode != ZYDIS_BROADCAST_MODE_INVALID)
                goto LAB_0010fcc5;
                uVar10 = uVar10 >> 2;
                goto LAB_0010fc63;
              }
              if (ZVar22 == '\x02') {
                if ((instruction->avx).broadcast.mode == ZYDIS_BROADCAST_MODE_INVALID) {
                  uVar10 = uVar10 >> 1;
                  goto LAB_0010fc63;
                }
LAB_0010fcc5:
                operand->size = (ushort)bVar6;
              }
              else {
                if (ZVar22 != '\x01') {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                                ,0x41b,
                                "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                               );
                }
                if ((instruction->avx).broadcast.mode != ZYDIS_BROADCAST_MODE_INVALID)
                goto LAB_0010fcc5;
                operand->size = uVar10;
              }
            }
            else {
              uVar10 = sVar8 << 3;
LAB_0010fc63:
              operand->size = uVar10;
            }
            if (operand->size == 0) {
              __assert_fail("operand->size",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x41e,
                            "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                           );
            }
            goto LAB_0010faef;
          }
          if (ZVar2 != ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x48f,
                          "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                         );
          }
          sVar8 = *(short *)((long)pZVar15->size + lVar25 + (ulong)context->eosz_index * 2);
          if (sVar8 != 0) goto LAB_0010fa5d;
          if ((*(byte *)((long)pZVar15->size + lVar25 + 6) & 0x1f) != 1) {
            __assert_fail("definition->element_type == ZYDIS_IELEMENT_TYPE_VARIABLE",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x42b,
                          "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                         );
          }
          if ((instruction->avx).vector_length != 0x200) {
            __assert_fail("instruction->avx.vector_length == 512",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x42c,
                          "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                         );
          }
          switch((instruction->avx).conversion.mode) {
          case ZYDIS_CONVERSION_MODE_INVALID:
            goto switchD_0010fbeb_caseD_0;
          case ZYDIS_CONVERSION_MODE_FLOAT16:
            operand->size = 0x100;
            ZVar11 = 0x10;
            ZVar18 = ZYDIS_ELEMENT_TYPE_FLOAT16;
            goto switchD_0010fc1c_caseD_a;
          case ZYDIS_CONVERSION_MODE_SINT8:
            operand->size = 0x80;
            ZVar5 = 8;
            goto switchD_0010fc1c_caseD_e;
          case ZYDIS_CONVERSION_MODE_REQUIRED_BITS:
            operand->size = 0x80;
            ZVar11 = 8;
            goto LAB_0010fd24;
          case ZYDIS_CONVERSION_MODE_SINT16:
            operand->size = 0x100;
            ZVar5 = 0x10;
            goto switchD_0010fc1c_caseD_e;
          case ZYDIS_CONVERSION_MODE_MAX_VALUE:
            operand->size = 0x100;
            ZVar11 = 0x10;
LAB_0010fd24:
            ZVar18 = ZYDIS_ELEMENT_TYPE_UINT;
            goto switchD_0010fc1c_caseD_a;
          default:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x476,
                          "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                         );
          }
        case ZYDIS_OPERAND_TYPE_POINTER:
          bVar6 = (instruction->raw).imm[0].size;
          if ((bVar6 != 0x10) && (bVar6 != 0x20)) {
            __assert_fail("(instruction->raw.imm[0].size == 16) || (instruction->raw.imm[0].size == 32)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x494,
                          "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                         );
          }
          if ((instruction->raw).imm[1].size != '\x10') {
            __assert_fail("instruction->raw.imm[1].size == 16",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x495,
                          "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                         );
          }
          ZVar7 = bVar6 + 0x10;
          break;
        case ZYDIS_OPERAND_TYPE_IMMEDIATE:
          sVar8 = *(short *)((long)pZVar15->size + lVar25 + (ulong)context->eosz_index * 2);
LAB_0010fa5d:
          ZVar7 = sVar8 << 3;
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x49c,
                        "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                       );
        }
        goto LAB_0010fa60;
      }
    }
  }
  return ZVar12;
switchD_0010fbeb_caseD_0:
  operand->size = 0x200;
  ZVar11 = 0x20;
  ZVar18 = ZYDIS_ELEMENT_TYPE_FLOAT32;
  ZVar5 = 0x20;
  switch((context->mvex).functionality) {
  case '\n':
  case '\f':
  case '\x12':
  case '\x16':
    break;
  case '\v':
    operand->size = 0x100;
    break;
  case '\r':
  case '\x13':
  case '\x17':
    ZVar11 = 0x40;
    ZVar18 = ZYDIS_ELEMENT_TYPE_FLOAT64;
    break;
  case '\x0e':
  case '\x10':
  case '\x14':
  case '\x18':
    goto switchD_0010fc1c_caseD_e;
  case '\x0f':
    operand->size = 0x100;
    goto switchD_0010fc1c_caseD_e;
  case '\x11':
  case '\x15':
  case '\x19':
    ZVar5 = 0x40;
switchD_0010fc1c_caseD_e:
    ZVar11 = ZVar5;
    ZVar18 = ZYDIS_ELEMENT_TYPE_INT;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x459,
                  "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                 );
  }
switchD_0010fc1c_caseD_a:
  operand->element_type = ZVar18;
  operand->element_size = ZVar11;
  ZVar3 = (instruction->avx).broadcast.mode;
  if (ZVar3 - ZYDIS_BROADCAST_MODE_1_TO_8 < 2) {
    operand->size = operand->element_size;
  }
  else if (ZVar3 - ZYDIS_BROADCAST_MODE_4_TO_8 < 2) {
    iVar4._0_2_ = operand->element_size;
    iVar4._2_2_ = operand->element_count;
    ZVar7 = (ZyanU16)(iVar4 << 2);
LAB_0010fa60:
    operand->size = ZVar7;
  }
  else if (ZVar3 != ZYDIS_BROADCAST_MODE_INVALID) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x487,
                  "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                 );
  }
LAB_0010faef:
  element = *(byte *)((long)pZVar15->size + lVar25 + 6) &
            (ZYDIS_IELEMENT_TYPE_CC5|ZYDIS_IELEMENT_TYPE_INT);
  if ((1 < (byte)element) &&
     (ZydisGetElementInfo(element,&operand->element_type,&operand->element_size),
     operand->element_size == 0)) {
    operand->element_size = operand->size;
  }
  uVar10 = 1;
  if (((operand->element_size != 0) && (operand->size != 0)) &&
     (operand->element_type != ZYDIS_ELEMENT_TYPE_CC)) {
    uVar10 = operand->size / operand->element_size;
  }
  operand->element_count = uVar10;
  lVar25 = lVar25 + 0xd;
  ZVar26 = ZVar26 + '\x01';
  operand = operand + 1;
  if ((ulong)(uVar21 & 0xff) * 0xd == lVar25) {
    if ((instruction->avx).mask.mode != ZYDIS_MASK_MODE_MERGING) {
      return 0x100000;
    }
    if (operands->actions == '\x03') {
      bVar24 = 9;
    }
    else {
      if (operands->actions != '\x02') {
        return 0x100000;
      }
      bVar24 = operands->type == ZYDIS_OPERAND_TYPE_MEMORY ^ 9;
    }
    operands->actions = bVar24;
    return 0x100000;
  }
  goto LAB_0010f123;
}

Assistant:

ZyanStatus ZydisDecoderDecodeOperands(const ZydisDecoder* decoder,
    const ZydisDecoderContext* context, const ZydisDecodedInstruction* instruction,
    ZydisDecodedOperand* operands, ZyanU8 operand_count)
{
#ifdef ZYDIS_MINIMAL_MODE

    ZYAN_UNUSED(decoder);
    ZYAN_UNUSED(context);
    ZYAN_UNUSED(instruction);
    ZYAN_UNUSED(operands);
    ZYAN_UNUSED(operand_count);

    return ZYAN_STATUS_MISSING_DEPENDENCY; // TODO: Introduce better status code

#else

    if (!decoder || !context || !context->definition || !instruction ||
        (operand_count && !operands) || (operand_count > ZYDIS_MAX_OPERAND_COUNT))
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    if (decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_MINIMAL))
    {
        return ZYAN_STATUS_MISSING_DEPENDENCY; // TODO: Introduce better status code
    }

    operand_count = ZYAN_MIN(operand_count, instruction->operand_count);
    if (!operand_count)
    {
        return ZYAN_STATUS_SUCCESS;
    }

    return ZydisDecodeOperands(decoder, context, instruction, operands, operand_count);

#endif
}